

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

SimpleAssignmentPatternSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::SimpleAssignmentPatternSyntax,slang::syntax::SimpleAssignmentPatternSyntax_const&>
          (BumpAllocator *this,SimpleAssignmentPatternSyntax *args)

{
  SyntaxNode *pSVar1;
  Info *pIVar2;
  size_t sVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  SimpleAssignmentPatternSyntax *pSVar8;
  
  pSVar8 = (SimpleAssignmentPatternSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((SimpleAssignmentPatternSyntax *)this->endPtr < pSVar8 + 1) {
    pSVar8 = (SimpleAssignmentPatternSyntax *)allocateSlow(this,0x70,8);
  }
  else {
    this->head->current = (byte *)(pSVar8 + 1);
  }
  (pSVar8->super_AssignmentPatternSyntax).super_SyntaxNode.previewNode =
       (args->super_AssignmentPatternSyntax).super_SyntaxNode.previewNode;
  uVar4 = *(undefined4 *)&(args->super_AssignmentPatternSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_AssignmentPatternSyntax).super_SyntaxNode.parent;
  (pSVar8->super_AssignmentPatternSyntax).super_SyntaxNode.kind =
       (args->super_AssignmentPatternSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pSVar8->super_AssignmentPatternSyntax).super_SyntaxNode.field_0x4 = uVar4;
  (pSVar8->super_AssignmentPatternSyntax).super_SyntaxNode.parent = pSVar1;
  uVar5 = (args->openBrace).field_0x2;
  NVar6.raw = (args->openBrace).numFlags.raw;
  uVar7 = (args->openBrace).rawLen;
  pIVar2 = (args->openBrace).info;
  (pSVar8->openBrace).kind = (args->openBrace).kind;
  (pSVar8->openBrace).field_0x2 = uVar5;
  (pSVar8->openBrace).numFlags = (NumericTokenFlags)NVar6.raw;
  (pSVar8->openBrace).rawLen = uVar7;
  (pSVar8->openBrace).info = pIVar2;
  (pSVar8->items).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->items).super_SyntaxListBase.super_SyntaxNode.previewNode;
  uVar4 = *(undefined4 *)&(args->items).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->items).super_SyntaxListBase.super_SyntaxNode.parent;
  (pSVar8->items).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->items).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pSVar8->items).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pSVar8->items).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pSVar8->items).super_SyntaxListBase.childCount = (args->items).super_SyntaxListBase.childCount;
  (pSVar8->items).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00623350;
  sVar3 = (args->items).elements._M_extent._M_extent_value;
  (pSVar8->items).elements._M_ptr = (args->items).elements._M_ptr;
  (pSVar8->items).elements._M_extent._M_extent_value = sVar3;
  uVar5 = (args->closeBrace).field_0x2;
  NVar6.raw = (args->closeBrace).numFlags.raw;
  uVar7 = (args->closeBrace).rawLen;
  pIVar2 = (args->closeBrace).info;
  (pSVar8->closeBrace).kind = (args->closeBrace).kind;
  (pSVar8->closeBrace).field_0x2 = uVar5;
  (pSVar8->closeBrace).numFlags = (NumericTokenFlags)NVar6.raw;
  (pSVar8->closeBrace).rawLen = uVar7;
  (pSVar8->closeBrace).info = pIVar2;
  return pSVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }